

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O3

bool compareSR(Result *r1,Result *r2)

{
  InstrInfo IVar1;
  
  if (r1->opcode == r2->opcode) {
    IVar1 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,r1->opcode);
    return r1->sr == r2->sr || (IVar1.I & ~ADD) == DIVS;
  }
  __assert_fail("r1.opcode == r2.opcode",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Runner/Testrunner.cpp"
                ,0x2fd,"bool compareSR(Result &, Result &)");
}

Assistant:

bool compareSR(Result &r1, Result &r2)
{
    assert(r1.opcode == r2.opcode);
    moira::Instr instr = moiracpu->getInstrInfo(r1.opcode).I;
    if (instr == Instr::DIVU || instr == Instr::DIVS) {

        // Musashi differs (and is likely wrong). Ignore it
        return true;
    }

    return r1.sr == r2.sr;
}